

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void BasePort::AddHardwareVersionStringList(string *hStr)

{
  ulong uVar1;
  string local_70;
  string local_40;
  long local_20;
  size_type p;
  size_type n;
  string *hStr_local;
  
  n = (size_type)hStr;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    p = 0;
    while (p != 0xffffffffffffffff) {
      local_20 = std::__cxx11::string::find((char)n,0x2c);
      if (local_20 == -1) {
        std::__cxx11::string::substr((ulong)&local_40,n);
        AddHardwareVersionString(&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        p = 0xffffffffffffffff;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,n);
        AddHardwareVersionString(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        p = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

void BasePort::AddHardwareVersionStringList(const std::string &hStr)
{
    if (hStr.empty()) return;
    std::string::size_type n = 0;
    while (n != std::string::npos) {
        std::string::size_type p = hStr.find(',', n);
        if (p == std::string::npos) {
            AddHardwareVersionString(hStr.substr(n, p));
            n = std::string::npos;
        }
        else {
            AddHardwareVersionString(hStr.substr(n, (p-n)));
            n = p+1;
        }
    }
}